

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::XMLReader::refreshCharBuffer(XMLReader *this)

{
  XMLSize_t XVar1;
  XMLTranscoder *pXVar2;
  XMLSize_t XVar3;
  ulong uVar4;
  long lVar5;
  TranscodingException *this_00;
  XMLFilePos XVar6;
  ulong uVar7;
  uint uVar8;
  XMLSize_t XVar9;
  pointer_____offset_0x10___ *ppuVar10;
  long lVar11;
  Codes failReason;
  
  if (this->fNoMore != false) {
    return false;
  }
  XVar3 = this->fCharsAvail;
  XVar1 = this->fCharIndex;
  lVar11 = XVar3 - XVar1;
  if (lVar11 == 0x4000) {
    return true;
  }
  if (this->fTranscoder == (XMLTranscoder *)0x0) {
    if (this->fEncoding == EBCDIC) {
      this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
      RuntimeException::RuntimeException
                ((RuntimeException *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                 ,0x22a,Reader_EncodingStrRequired,this->fMemoryManager);
      ppuVar10 = &RuntimeException::typeinfo;
LAB_002bf16a:
      __cxa_throw(this_00,ppuVar10,XMLException::~XMLException);
    }
    pXVar2 = XMLTransService::makeNewTranscoderFor
                       (XMLPlatformUtils::fgTransService,this->fEncodingStr,&failReason,0x4000,
                        this->fMemoryManager);
    this->fTranscoder = pXVar2;
    if (pXVar2 == (XMLTranscoder *)0x0) {
      this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
      TranscodingException::TranscodingException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                 ,0x23e,Trans_CantCreateCvtrFor,this->fEncodingStr,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0,this->fMemoryManager);
      ppuVar10 = &TranscodingException::typeinfo;
      goto LAB_002bf16a;
    }
  }
  if (this->fCalculateSrcOfs == true) {
    XVar6 = this->fSrcOfsBase;
    for (XVar9 = 0; this->fCharIndex != XVar9; XVar9 = XVar9 + 1) {
      XVar6 = XVar6 + this->fCharSizeBuf[XVar9];
      this->fSrcOfsBase = XVar6;
    }
  }
  if (XVar3 == XVar1) {
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    for (uVar4 = this->fCharIndex; uVar4 < this->fCharsAvail; uVar4 = uVar4 + 1) {
      this->fCharBuf[lVar5] = this->fCharBuf[uVar4];
      this->fCharSizeBuf[lVar5] = this->fCharSizeBuf[uVar4];
      lVar5 = lVar5 + 1;
    }
  }
  XVar3 = xcodeMoreChars(this,this->fCharBuf + lVar5,this->fCharSizeBuf + lVar5,0x4000 - lVar11);
  this->fCharIndex = 0;
  uVar4 = XVar3 + lVar11;
  this->fCharsAvail = uVar4;
  if (((uVar4 == 0) && (this->fType == Type_PE)) && (this->fRefFrom == RefFrom_NonLiteral)) {
    if (this->fSentTrailingSpace == false) {
      this->fCharBuf[0] = L' ';
      this->fCharsAvail = 1;
      this->fSentTrailingSpace = true;
      uVar4 = 1;
      goto LAB_002bf078;
    }
  }
  else if (uVar4 != 0) goto LAB_002bf078;
  this->fNoMore = true;
  uVar4 = 0;
LAB_002bf078:
  if (this->fCalculateSrcOfs == true) {
    this->fCharOfsBuf[0] = 0;
    uVar8 = 0;
    uVar7 = 0;
    while (uVar7 + 1 < uVar4) {
      uVar8 = uVar8 + this->fCharSizeBuf[uVar7];
      this->fCharOfsBuf[uVar7 + 1] = uVar8;
      uVar7 = uVar7 + 1;
    }
  }
  return uVar4 != 0;
}

Assistant:

bool XMLReader::refreshCharBuffer()
{
    // If the no more flag is set, then don't bother doing anything.
    if (fNoMore)
        return false;

    XMLSize_t startInd;

    // See if we have any existing chars.
    const XMLSize_t spareChars = fCharsAvail - fCharIndex;

    // If we are full, then don't do anything.
    if (spareChars == kCharBufSize)
        return true;

    //
    //  If no transcoder has been created yet, then we never saw the
    //  any encoding="" string and the encoding was not forced, so lets
    //  create one now. We know that it won't change now.
    //
    //  However, note that if we autosensed EBCDIC, then we have to
    //  consider it an error if we never got an encoding since we don't
    //  know what variant of EBCDIC it is.
    //
    if (!fTranscoder)
    {
        if (fEncoding == XMLRecognizer::EBCDIC)
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Reader_EncodingStrRequired, fMemoryManager);

        // Ask the transcoding service to make use a transcoder
        XMLTransService::Codes failReason;
        fTranscoder = XMLPlatformUtils::fgTransService->makeNewTranscoderFor
        (
            fEncodingStr
            , failReason
            , kCharBufSize
            , fMemoryManager
        );

        if (!fTranscoder)
        {
            ThrowXMLwithMemMgr1
            (
                TranscodingException
                , XMLExcepts::Trans_CantCreateCvtrFor
                , fEncodingStr
                , fMemoryManager
            );
        }
    }

    //
    //  Add the number of source bytes eaten so far to the base src
    //  offset member.
    //
    if (fCalculateSrcOfs) {
        for (startInd = 0; startInd < fCharIndex; startInd++)
            fSrcOfsBase += fCharSizeBuf[startInd];
    }

    //
    //  If there are spare chars, then move then down to the bottom. We
    //  have to move the char sizes down also.
    //
    startInd = 0;
    if (spareChars)
    {
        for (XMLSize_t index = fCharIndex; index < fCharsAvail; index++)
        {
            fCharBuf[startInd] = fCharBuf[index];
            fCharSizeBuf[startInd] = fCharSizeBuf[index];
            startInd++;
        }
    }

    //
    //  And then get more chars, starting after any spare chars that were
    //  left over from the last time.
    //
    fCharsAvail = xcodeMoreChars
    (
        &fCharBuf[startInd]
        , &fCharSizeBuf[startInd]
        , kCharBufSize - spareChars
    );

    // Add back in the spare chars
    fCharsAvail += spareChars;

    // Reset the buffer index to zero, so we start from the 0th char again
    fCharIndex = 0;

    //
    //  If no chars available, then we have to check for one last thing. If
    //  this is reader for a PE and its not being expanded inside a literal,
    //  then unget a trailing space. We use a boolean to avoid triggering
    //  this more than once.
    //
    if (!fCharsAvail
    &&  (fType == Type_PE)
    &&  (fRefFrom == RefFrom_NonLiteral)
    &&  !fSentTrailingSpace)
    {
        fCharBuf[0] = chSpace;
        fCharsAvail = 1;
        fSentTrailingSpace = true;
    }

    //
    //  If we get here with no more chars, then set the fNoMore flag which
    //  lets us optimize and know without checking that no more chars are
    //  available.
    //
    if (!fCharsAvail)
        fNoMore = true;

    //  Calculate fCharOfsBuf using the elements from fCharBufSize
    if (fCalculateSrcOfs)
    {
        unsigned int last = 0;
        fCharOfsBuf[0] = 0;
        for (XMLSize_t index = 1; index < fCharsAvail; ++index) {
            fCharOfsBuf[index] = last+fCharSizeBuf[index-1];
            last = fCharOfsBuf[index];
            // code was:
            // fCharOfsBuf[index] = fCharOfsBuf[index-1]+fCharSizeBuf[index-1];
            // but on Solaris 64 bit with sun studio 11 this didn't work as
            // every value of fCharOfsBuf[] was 1.
        }
    }

    return (fCharsAvail != 0);
}